

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O3

int WaitNsMDM(int n)

{
  int iVar1;
  timespec local_38;
  
  iVar1 = 1;
  if ((bExit == 0) && (AcousticCommandMDM != 0)) {
    if (n != 0) {
      do {
        local_38.tv_sec = 1;
        local_38.tv_nsec = 0;
        nanosleep(&local_38,(timespec *)0x0);
        if (bExit != 0) {
          return 1;
        }
        if (AcousticCommandMDM == 0) {
          return 1;
        }
        n = n + -1;
      } while (n != 0);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

inline int WaitNsMDM(int n)
{
	int i = n;

	if (bExit||!AcousticCommandMDM) return EXIT_FAILURE;
	while (i)
	{
		mSleep(1000);
		if (bExit||!AcousticCommandMDM) return EXIT_FAILURE;
		i--;
	}

	return EXIT_SUCCESS;
}